

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

void modifyChannels<float>
               (list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *channels,
               float delta)

{
  float fVar1;
  bool bVar2;
  reference this;
  long lVar3;
  float *pfVar4;
  float in_XMM0_Da;
  int x;
  int y;
  Array2D<float> *channel;
  iterator i;
  list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
  *in_stack_ffffffffffffffa8;
  int local_30;
  int local_2c;
  _Self local_20;
  _Self local_18;
  float local_c;
  
  local_c = in_XMM0_Da;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>::begin
                 (in_stack_ffffffffffffffa8);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>::end
                   (in_stack_ffffffffffffffa8);
    bVar2 = std::operator!=(&local_18,&local_20);
    if (!bVar2) break;
    this = std::_List_iterator<Imf_3_4::Array2D<float>_>::operator*
                     ((_List_iterator<Imf_3_4::Array2D<float>_> *)0x119e2f);
    local_2c = 0;
    while( true ) {
      lVar3 = Imf_3_4::Array2D<float>::height(this);
      if (lVar3 <= local_2c) break;
      local_30 = 0;
      while( true ) {
        lVar3 = Imf_3_4::Array2D<float>::width(this);
        fVar1 = local_c;
        if (lVar3 <= local_30) break;
        pfVar4 = Imf_3_4::Array2D<float>::operator[](this,(long)local_2c);
        pfVar4[local_30] = fVar1 + pfVar4[local_30];
        local_30 = local_30 + 1;
      }
      local_2c = local_2c + 1;
    }
    std::_List_iterator<Imf_3_4::Array2D<float>_>::operator++(&local_18,0);
  }
  return;
}

Assistant:

void
modifyChannels (list<Array2D<T>>& channels, T delta)
{
    //
    // Dummy code modifying each pixel by incrementing every channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                channel[y][x] += delta;
            }
        }
    }
}